

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::doRemoveRow(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,int i)

{
  SPxStatus SVar1;
  
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::doRemoveRow(&this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ,i);
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x77])(this);
  if ((this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thestatus < SINGULAR) {
    return;
  }
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::removedRow(&this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,i);
  SVar1 = (this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thestatus;
  if (SVar1 != INFEASIBLE) {
    if (SVar1 == OPTIMAL) {
      if (this->m_status == OPTIMAL) {
        this->m_status = UNKNOWN;
      }
      if ((this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thestatus == PRIMAL) {
        return;
      }
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thestatus = PRIMAL;
      return;
    }
    if (SVar1 != DUAL) {
      return;
    }
  }
  if (this->m_status == OPTIMAL) {
    this->m_status = UNKNOWN;
  }
  if ((this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thestatus != REGULAR) {
    (this->
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thestatus = REGULAR;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::doRemoveRow(int i)
{

   SPxLPBase<R>::doRemoveRow(i);

   unInit();

   if(SPxBasisBase<R>::status() > SPxBasisBase<R>::NO_PROBLEM)
   {
      this->removedRow(i);

      switch(SPxBasisBase<R>::status())
      {
      case SPxBasisBase<R>::DUAL:
      case SPxBasisBase<R>::INFEASIBLE:
         setBasisStatus(SPxBasisBase<R>::REGULAR);
         break;

      case SPxBasisBase<R>::OPTIMAL:
         setBasisStatus(SPxBasisBase<R>::PRIMAL);
         break;

      default:
         break;
      }
   }
}